

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

SmallBuffer * helics::typeConvertDefV(SmallBuffer *__return_storage_ptr__,defV *val)

{
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar1;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *val_00;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *val_01;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *val_02;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *val_03;
  char *in_R8;
  string_view val_04;
  
  switch((val->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar1 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    typeConvert(__return_storage_ptr__,HELICS_DOUBLE,*pvVar1);
    break;
  case '\x01':
    pvVar3 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    typeConvert(__return_storage_ptr__,HELICS_INT,*pvVar3);
    break;
  default:
    pvVar2 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    val_04._M_str = in_R8;
    val_04._M_len = (size_t)(pvVar2->_M_dataplus)._M_p;
    typeConvert(__return_storage_ptr__,(helics *)0x0,(DataType)pvVar2->_M_string_length,val_04);
    break;
  case '\x03':
    val_00 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    typeConvert(__return_storage_ptr__,HELICS_COMPLEX,val_00);
    break;
  case '\x04':
    val_02 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    typeConvert(__return_storage_ptr__,HELICS_VECTOR,val_02);
    break;
  case '\x05':
    val_03 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    typeConvert(__return_storage_ptr__,HELICS_COMPLEX_VECTOR,val_03);
    break;
  case '\x06':
    val_01 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (val);
    typeConvert(__return_storage_ptr__,HELICS_NAMED_POINT,val_01);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvertDefV(const defV& val)
{
    switch (val.index()) {
        case double_loc:  // double
            return typeConvert(DataType::HELICS_DOUBLE, std::get<double>(val));
        case int_loc:  // int64_t
            return typeConvert(DataType::HELICS_INT, std::get<int64_t>(val));
        case string_loc:  // string
        default:
            return typeConvert(DataType::HELICS_STRING,
                               std::string_view{std::get<std::string>(val)});
        case complex_loc:  // complex
            return typeConvert(DataType::HELICS_COMPLEX, std::get<std::complex<double>>(val));
        case vector_loc:  // vector
            return typeConvert(DataType::HELICS_VECTOR, std::get<std::vector<double>>(val));
        case complex_vector_loc:  // complex
            return typeConvert(DataType::HELICS_COMPLEX_VECTOR,
                               std::get<std::vector<std::complex<double>>>(val));
        case named_point_loc:
            return typeConvert(DataType::HELICS_NAMED_POINT, std::get<NamedPoint>(val));
    }
}